

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O2

void NativeCodeData::AddFixupEntryForPointerArray(void *startAddress,DataChunk *chunkList)

{
  void *data;
  code *pcVar1;
  bool bVar2;
  DataChunk *pDVar3;
  DataChunk *pDVar4;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar5;
  DataChunk *pDVar6;
  ulong uVar7;
  undefined4 *local_38;
  
  pDVar3 = GetDataChunk(startAddress);
  if ((pDVar3->len & 7) == 0) {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x61,"(chunk->len % sizeof(void*) == 0)","chunk->len % sizeof(void*) == 0");
    if (!bVar2) {
LAB_0058a786:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_38 = 0;
  }
  uVar7 = 0;
  do {
    if (pDVar3->len >> 3 <= uVar7) {
      return;
    }
    data = *(void **)((long)startAddress + uVar7 * 8);
    if (data != (void *)0x0) {
      pDVar4 = GetDataChunk(data);
      bVar2 = false;
      for (pDVar6 = chunkList; (!bVar2 && (pDVar6 != (DataChunk *)0x0)); pDVar6 = pDVar6->next) {
        bVar2 = pDVar6 == pDVar4;
      }
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                           ,0x76,"(foundTargetChunk)",
                           "current pointer is not allocated with NativeCodeData allocator?");
        if (!bVar2) goto LAB_0058a786;
        *local_38 = 0;
      }
      hHeap = GetProcessHeap();
      pNVar5 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
      if (pNVar5 == (NativeDataFixupEntry *)0x0) {
        Js::Throw::OutOfMemory();
      }
      pNVar5->addrOffset = (int)uVar7 * 8;
      pNVar5->targetTotalOffset = pDVar4->offset;
      pNVar5->next = pDVar3->fixupList;
      pDVar3->fixupList = pNVar5;
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,NativeCodeDataPhase);
      if (bVar2) {
        Output::Print(L"NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                      startAddress,uVar7 & 0xffffffff,(ulong)pNVar5->addrOffset,pDVar3,data,pDVar4,
                      pDVar3->dataType);
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void
NativeCodeData::AddFixupEntryForPointerArray(void* startAddress, DataChunk * chunkList)
{
    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);
    Assert(chunk->len % sizeof(void*) == 0);
    for (unsigned int i = 0; i < chunk->len / sizeof(void*); i++)
    {
        size_t offset = i * sizeof(void*);
        void* targetAddr = *(void**)((char*)startAddress + offset);

        if (targetAddr == nullptr)
        {
            continue;
        }

        DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetAddr);

#if DBG
        bool foundTargetChunk = false;
        DataChunk* chunk1 = chunkList;
        while (chunk1 && !foundTargetChunk)
        {
            foundTargetChunk = (chunk1 == targetChunk);
            chunk1 = chunk1->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
#endif

        NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
        if (!entry)
        {
            Js::Throw::OutOfMemory();
        }
        __analysis_assume(entry);
        entry->addrOffset = (unsigned int)offset;
        entry->targetTotalOffset = targetChunk->offset;
        entry->next = chunk->fixupList;
        chunk->fixupList = entry;

#if DBG
        if (PHASE_TRACE1(Js::NativeCodeDataPhase))
        {
            Output::Print(_u("NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
                startAddress, i, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
        }
#endif
    }
}